

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DestroyContext(ImGuiContext *ctx)

{
  if (ctx == (ImGuiContext *)0x0) {
    ctx = GImGui;
  }
  Shutdown(ctx);
  if (GImGui == ctx) {
    GImGui = (ImGuiContext *)0x0;
  }
  IM_DELETE<ImGuiContext>(ctx);
  return;
}

Assistant:

void ImGui::DestroyContext(ImGuiContext* ctx)
{
    if (ctx == NULL)
        ctx = GImGui;
    Shutdown(ctx);
    if (GImGui == ctx)
        SetCurrentContext(NULL);
    IM_DELETE(ctx);
}